

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O0

int compute_depth_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *this;
  int depth;
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    this = Am_Object::Get(&local_20,0x86,0);
    iVar2 = Am_Value::operator_cast_to_int(this);
    if (iVar2 == -1) {
      self_local._4_4_ = -1;
    }
    else {
      self_local._4_4_ = iVar2 + 1;
    }
  }
  else {
    self_local._4_4_ = -1;
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, compute_depth)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    int depth = owner.Get(Am_OWNER_DEPTH);
    if (depth == -1)
      return -1;
    else
      return depth + 1;
  } else
    return -1;
}